

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O0

void __thiscall ixy::IxgbeDevice::wait_set_reg32(IxgbeDevice *this,uint64_t reg,uint32_t mask)

{
  LogData<ixy::Pair<ixy::None,_const_char_*>_> begin;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>_> begin_00;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>,_const_char_*>_>
  begin_01;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_long_&>_>
  begin_02;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_long_&>,_const_char_*>_>
  begin_03;
  undefined8 in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  int local_10c;
  duration<long,_std::ratio<1L,_1000L>_> local_108;
  undefined1 local_f9 [9];
  LogData<ixy::Pair<ixy::None,_const_char_*>_> *local_f0;
  LogData<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>_> local_e8;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>,_const_char_*>_>
  local_d0;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_long_&>_>
  local_b0;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_long_&>,_const_char_*>_>
  local_88;
  LogData<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,_const_char_*>,_const_unsigned_int_&>,_const_char_*>,_const_unsigned_long_&>,_const_char_*>,_const_unsigned_int_&>_>
  local_58;
  uint local_20;
  uint local_1c;
  uint32_t cur;
  uint32_t mask_local;
  uint64_t reg_local;
  IxgbeDevice *this_local;
  
  local_1c = mask;
  _cur = reg;
  reg_local = (uint64_t)this;
  while (local_20 = *(uint *)(this->addr + _cur), (local_20 & local_1c) != local_1c) {
    memset(local_f9,0,1);
    local_f0 = ixy::operator<<("waiting for flags ");
    begin.list.second = in_stack_fffffffffffffec0;
    begin.list._0_8_ = in_stack_fffffffffffffeb8;
    ixy::operator<<(&local_e8,begin,(uint *)local_f0);
    begin_00.list.first.second = local_e8.list.first.second;
    begin_00.list.first._0_8_ = local_e8.list.first._0_8_;
    begin_00.list.second = local_e8.list.second;
    ixy::operator<<(&local_d0,begin_00,(char (*) [14])" in register ");
    begin_01.list.first.first.second = local_d0.list.first.first.second;
    begin_01.list.first.first._0_8_ = local_d0.list.first.first._0_8_;
    begin_01.list.first.second = local_d0.list.first.second;
    begin_01.list.second = local_d0.list.second;
    ixy::operator<<(&local_b0,begin_01,(unsigned_long *)&cur);
    begin_02.list.first.first.first.second = local_b0.list.first.first.first.second;
    begin_02.list.first.first.first._0_8_ = local_b0.list.first.first.first._0_8_;
    begin_02.list.first.first.second = local_b0.list.first.first.second;
    begin_02.list.first.second = local_b0.list.first.second;
    begin_02.list.second = local_b0.list.second;
    ixy::operator<<(&local_88,begin_02,(char (*) [17])0x1196bb);
    begin_03.list.first.first.first.first.second = local_88.list.first.first.first.first.second;
    begin_03.list.first.first.first.first._0_8_ = local_88.list.first.first.first.first._0_8_;
    begin_03.list.first.first.first.second = local_88.list.first.first.first.second;
    begin_03.list.first.first.second = local_88.list.first.first.second;
    begin_03.list.first.second = local_88.list.first.second;
    begin_03.list.second = local_88.list.second;
    in_stack_fffffffffffffeb8 = local_88.list.first.first.first.first._0_8_;
    in_stack_fffffffffffffec0 = local_88.list.first.first.first.first.second;
    ixy::operator<<(&local_58,begin_03,&local_20);
    debug<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::Pair<ixy::None,char_const*>,unsigned_int_const&>,char_const*>,unsigned_long_const&>,char_const*>,unsigned_int_const&>>
              ("/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
               ,0x1ee,"wait_set_reg32",&local_58);
    local_10c = 10;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              ((duration<long,std::ratio<1l,1000l>> *)&local_108,&local_10c);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_108);
  }
  return;
}

Assistant:

inline void IxgbeDevice::wait_set_reg32(uint64_t reg, uint32_t mask) {
    __asm__ volatile ("" : : : "memory");
    uint32_t cur;
    while (cur = *(reinterpret_cast<volatile uint32_t *>(addr + reg)), (cur & mask) != mask) {
        debug("waiting for flags " << mask << " in register " << reg << ", current value " << cur);
        std::this_thread::sleep_for(std::chrono::milliseconds(10));
        __asm__ volatile ("" : : : "memory");
    }
}